

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O2

bool __thiscall
capnp::compiler::BrandedDecl::compileAsType
          (BrandedDecl *this,ErrorReporter *errorReporter,Builder target)

{
  BrandScope *pBVar1;
  BrandedDecl *pBVar2;
  ErrorReporter *pEVar3;
  Builder target_00;
  Builder target_01;
  Builder target_02;
  Builder target_03;
  Reader name;
  bool bVar4;
  ulong uVar5;
  BrandScope *pBVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  char (*in_R8) [17];
  long lVar10;
  ElementCount EVar11;
  ulong uVar12;
  ResolvedParameter RVar13;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  BrandScope *local_170;
  Vector<capnp::compiler::BrandScope_*> levels;
  undefined8 local_130;
  undefined8 local_128;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_11f;
  undefined1 auStack_118 [32];
  Builder scopes;
  undefined1 local_d0 [40];
  Builder interface;
  Builder bindings;
  StructBuilder local_58;
  
  if ((this->body).tag == 2) {
    RVar13 = asVariable(this);
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    *(undefined8 *)((long)target._builder.data + 0x10) = 0;
    *(undefined2 *)target._builder.data = 0x12;
    if (RVar13.id == 0) {
      *(undefined2 *)((long)target._builder.data + 8) = 2;
    }
    else {
      *(undefined2 *)((long)target._builder.data + 8) = 1;
      *(uint64_t *)((long)target._builder.data + 0x10) = RVar13.id;
    }
    *(short *)((long)target._builder.data + 10) = (short)RVar13.index;
    return true;
  }
  switch(*(undefined2 *)((long)&(this->body).field_1 + 0x18)) {
  case 0:
  case 1:
  case 2:
  case 4:
  case 6:
  case 7:
  case 8:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    name._reader.capTable = (CapTableReader *)local_128;
    name._reader.segment = (SegmentReader *)local_130;
    name._reader.data._0_1_ = _kjCondition.value;
    name._reader.data._1_7_ = uStack_11f;
    name._reader.pointers = (WirePointer *)auStack_118._0_8_;
    name._reader._32_8_ = auStack_118._8_8_;
    name._reader._40_8_ = auStack_118._16_8_;
    expressionString(name);
    kj::str<char_const(&)[2],kj::String,char_const(&)[17]>
              ((String *)&scopes,(kj *)0x4c8c3f,&_kjCondition.value,(String *)"\' is not a type.",
               in_R8);
    if (scopes.builder.capTable == (CapTableBuilder *)0x0) {
      scopes.builder.segment = (SegmentBuilder *)0x4706a1;
    }
    message.content.size_ =
         (long)&((scopes.builder.capTable)->super_CapTableReader)._vptr_CapTableReader +
         (ulong)(scopes.builder.capTable == (CapTableBuilder *)0x0);
    message.content.ptr = (char *)scopes.builder.segment;
    ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
              (errorReporter,&this->source,message);
    kj::Array<char>::~Array((Array<char> *)&scopes);
    kj::Array<char>::~Array((Array<char> *)&_kjCondition);
    return false;
  case 3:
    capnp::schema::Type::Builder::initEnum((Builder *)&interface,&target);
    _kjCondition.value = (this->body).tag == 1;
    if (!_kjCondition.value) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                ((Fault *)&scopes,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                 ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",&_kjCondition);
      kj::_::Debug::Fault::fatal((Fault *)&scopes);
    }
    pBVar1 = (this->brand).ptr;
    levels.builder.ptr = (BrandScope **)0x0;
    levels.builder.pos = (RemoveConst<capnp::compiler::BrandScope_*> *)0x0;
    levels.builder.endPtr = (BrandScope **)0x0;
    levels.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
    pBVar6 = pBVar1;
    do {
      local_170 = pBVar6;
      if (((pBVar6->params).size_ != 0) ||
         ((pBVar6->inherited == true && (pBVar6->leafParamCount != 0)))) {
        kj::Vector<capnp::compiler::BrandScope*>::add<capnp::compiler::BrandScope*&>
                  ((Vector<capnp::compiler::BrandScope*> *)&levels,&local_170);
      }
      pBVar6 = (local_170->parent).ptr.ptr;
    } while (pBVar6 != (BrandScope *)0x0);
    if (levels.builder.pos != levels.builder.ptr) {
      capnp::schema::Type::Enum::Builder::initBrand((Builder *)&_kjCondition,(Builder *)&interface);
      capnp::schema::Brand::Builder::initScopes
                (&scopes,(Builder *)&_kjCondition,
                 (uint)((ulong)((long)levels.builder.pos - (long)levels.builder.ptr) >> 3));
      lVar10 = (long)levels.builder.pos - (long)levels.builder.ptr;
      uVar12 = 0;
      while( true ) {
        if (uVar12 == lVar10 >> 3) break;
        capnp::_::ListBuilder::getStructElement
                  ((StructBuilder *)&_kjCondition,&scopes.builder,(ElementCount)uVar12);
        pBVar6 = levels.builder.ptr[uVar12 & 0xffffffff];
        *(_func_int ***)auStack_118._8_8_ = (_func_int **)pBVar6->leafId;
        if (pBVar6->inherited == true) {
          *(undefined2 *)&((ArrayDisposer *)(auStack_118._8_8_ + 8))->_vptr_ArrayDisposer = 1;
        }
        else {
          capnp::schema::Brand::Scope::Builder::initBind
                    (&bindings,(Builder *)&_kjCondition,(uint)(pBVar6->params).size_);
          uVar5 = (ulong)bindings.builder.elementCount;
          EVar11 = 0;
          for (lVar9 = 0; uVar5 * 0xa8 - lVar9 != 0; lVar9 = lVar9 + 0xa8) {
            pBVar2 = (levels.builder.ptr[uVar12 & 0xffffffff]->params).ptr;
            pEVar3 = pBVar1->errorReporter;
            capnp::_::ListBuilder::getStructElement(&local_58,&bindings.builder,EVar11);
            capnp::schema::Brand::Binding::Builder::initType
                      ((Builder *)local_d0,(Builder *)&local_58);
            target_01._builder.capTable = (CapTableBuilder *)local_d0._8_8_;
            target_01._builder.segment = (SegmentBuilder *)local_d0._0_8_;
            target_01._builder.data = (void *)local_d0._16_8_;
            target_01._builder.pointers = (WirePointer *)local_d0._24_8_;
            target_01._builder.dataSize = local_d0._32_4_;
            target_01._builder.pointerCount = local_d0._36_2_;
            target_01._builder._38_2_ = local_d0._38_2_;
            compileAsType((BrandedDecl *)((long)&(pBVar2->body).tag + lVar9),pEVar3,target_01);
            EVar11 = EVar11 + 1;
          }
        }
        uVar12 = uVar12 + 1;
      }
    }
    kj::ArrayBuilder<capnp::compiler::BrandScope_*>::dispose(&levels.builder);
    goto LAB_0035bdef;
  case 5:
    capnp::schema::Type::Builder::initStruct((Builder *)&interface,&target);
    _kjCondition.value = (this->body).tag == 1;
    if (!_kjCondition.value) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                ((Fault *)&scopes,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                 ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",&_kjCondition);
      kj::_::Debug::Fault::fatal((Fault *)&scopes);
    }
    pBVar1 = (this->brand).ptr;
    levels.builder.ptr = (BrandScope **)0x0;
    levels.builder.pos = (RemoveConst<capnp::compiler::BrandScope_*> *)0x0;
    levels.builder.endPtr = (BrandScope **)0x0;
    levels.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
    pBVar6 = pBVar1;
    do {
      local_170 = pBVar6;
      if (((pBVar6->params).size_ != 0) ||
         ((pBVar6->inherited == true && (pBVar6->leafParamCount != 0)))) {
        kj::Vector<capnp::compiler::BrandScope*>::add<capnp::compiler::BrandScope*&>
                  ((Vector<capnp::compiler::BrandScope*> *)&levels,&local_170);
      }
      pBVar6 = (local_170->parent).ptr.ptr;
    } while (pBVar6 != (BrandScope *)0x0);
    if (levels.builder.pos != levels.builder.ptr) {
      capnp::schema::Type::Struct::Builder::initBrand
                ((Builder *)&_kjCondition,(Builder *)&interface);
      capnp::schema::Brand::Builder::initScopes
                (&scopes,(Builder *)&_kjCondition,
                 (uint)((ulong)((long)levels.builder.pos - (long)levels.builder.ptr) >> 3));
      lVar10 = (long)levels.builder.pos - (long)levels.builder.ptr;
      uVar12 = 0;
      while( true ) {
        if (uVar12 == lVar10 >> 3) break;
        capnp::_::ListBuilder::getStructElement
                  ((StructBuilder *)&_kjCondition,&scopes.builder,(ElementCount)uVar12);
        pBVar6 = levels.builder.ptr[uVar12 & 0xffffffff];
        *(_func_int ***)auStack_118._8_8_ = (_func_int **)pBVar6->leafId;
        if (pBVar6->inherited == true) {
          *(undefined2 *)&((ArrayDisposer *)(auStack_118._8_8_ + 8))->_vptr_ArrayDisposer = 1;
        }
        else {
          capnp::schema::Brand::Scope::Builder::initBind
                    (&bindings,(Builder *)&_kjCondition,(uint)(pBVar6->params).size_);
          uVar5 = (ulong)bindings.builder.elementCount;
          EVar11 = 0;
          for (lVar9 = 0; uVar5 * 0xa8 - lVar9 != 0; lVar9 = lVar9 + 0xa8) {
            pBVar2 = (levels.builder.ptr[uVar12 & 0xffffffff]->params).ptr;
            pEVar3 = pBVar1->errorReporter;
            capnp::_::ListBuilder::getStructElement(&local_58,&bindings.builder,EVar11);
            capnp::schema::Brand::Binding::Builder::initType
                      ((Builder *)local_d0,(Builder *)&local_58);
            target_02._builder.capTable = (CapTableBuilder *)local_d0._8_8_;
            target_02._builder.segment = (SegmentBuilder *)local_d0._0_8_;
            target_02._builder.data = (void *)local_d0._16_8_;
            target_02._builder.pointers = (WirePointer *)local_d0._24_8_;
            target_02._builder.dataSize = local_d0._32_4_;
            target_02._builder.pointerCount = local_d0._36_2_;
            target_02._builder._38_2_ = local_d0._38_2_;
            compileAsType((BrandedDecl *)((long)&(pBVar2->body).tag + lVar9),pEVar3,target_02);
            EVar11 = EVar11 + 1;
          }
        }
        uVar12 = uVar12 + 1;
      }
    }
    kj::ArrayBuilder<capnp::compiler::BrandScope_*>::dispose(&levels.builder);
    goto LAB_0035bdef;
  case 9:
    capnp::schema::Type::Builder::initInterface(&interface,&target);
    _kjCondition.value = (this->body).tag == 1;
    if (!_kjCondition.value) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                ((Fault *)&scopes,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                 ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",&_kjCondition);
      kj::_::Debug::Fault::fatal((Fault *)&scopes);
    }
    pBVar1 = (this->brand).ptr;
    levels.builder.ptr = (BrandScope **)0x0;
    levels.builder.pos = (RemoveConst<capnp::compiler::BrandScope_*> *)0x0;
    levels.builder.endPtr = (BrandScope **)0x0;
    levels.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
    pBVar6 = pBVar1;
    do {
      local_170 = pBVar6;
      if (((pBVar6->params).size_ != 0) ||
         ((pBVar6->inherited == true && (pBVar6->leafParamCount != 0)))) {
        kj::Vector<capnp::compiler::BrandScope*>::add<capnp::compiler::BrandScope*&>
                  ((Vector<capnp::compiler::BrandScope*> *)&levels,&local_170);
      }
      pBVar6 = (local_170->parent).ptr.ptr;
    } while (pBVar6 != (BrandScope *)0x0);
    if (levels.builder.pos != levels.builder.ptr) {
      capnp::schema::Type::Interface::Builder::initBrand((Builder *)&_kjCondition,&interface);
      capnp::schema::Brand::Builder::initScopes
                (&scopes,(Builder *)&_kjCondition,
                 (uint)((ulong)((long)levels.builder.pos - (long)levels.builder.ptr) >> 3));
      lVar10 = (long)levels.builder.pos - (long)levels.builder.ptr;
      uVar12 = 0;
      while( true ) {
        if (uVar12 == lVar10 >> 3) break;
        capnp::_::ListBuilder::getStructElement
                  ((StructBuilder *)&_kjCondition,&scopes.builder,(ElementCount)uVar12);
        pBVar6 = levels.builder.ptr[uVar12 & 0xffffffff];
        *(_func_int ***)auStack_118._8_8_ = (_func_int **)pBVar6->leafId;
        if (pBVar6->inherited == true) {
          *(undefined2 *)&((ArrayDisposer *)(auStack_118._8_8_ + 8))->_vptr_ArrayDisposer = 1;
        }
        else {
          capnp::schema::Brand::Scope::Builder::initBind
                    (&bindings,(Builder *)&_kjCondition,(uint)(pBVar6->params).size_);
          uVar5 = (ulong)bindings.builder.elementCount;
          EVar11 = 0;
          for (lVar9 = 0; uVar5 * 0xa8 - lVar9 != 0; lVar9 = lVar9 + 0xa8) {
            pBVar2 = (levels.builder.ptr[uVar12 & 0xffffffff]->params).ptr;
            pEVar3 = pBVar1->errorReporter;
            capnp::_::ListBuilder::getStructElement(&local_58,&bindings.builder,EVar11);
            capnp::schema::Brand::Binding::Builder::initType
                      ((Builder *)local_d0,(Builder *)&local_58);
            target_00._builder.capTable = (CapTableBuilder *)local_d0._8_8_;
            target_00._builder.segment = (SegmentBuilder *)local_d0._0_8_;
            target_00._builder.data = (void *)local_d0._16_8_;
            target_00._builder.pointers = (WirePointer *)local_d0._24_8_;
            target_00._builder.dataSize = local_d0._32_4_;
            target_00._builder.pointerCount = local_d0._36_2_;
            target_00._builder._38_2_ = local_d0._38_2_;
            compileAsType((BrandedDecl *)((long)&(pBVar2->body).tag + lVar9),pEVar3,target_00);
            EVar11 = EVar11 + 1;
          }
        }
        uVar12 = uVar12 + 1;
      }
    }
    kj::ArrayBuilder<capnp::compiler::BrandScope_*>::dispose(&levels.builder);
LAB_0035bdef:
    *(undefined8 *)((long)interface._builder.data + 8) = *(undefined8 *)&(this->body).field_1;
    break;
  case 0xe:
    *(undefined2 *)target._builder.data = 0;
    break;
  case 0xf:
    *(undefined2 *)target._builder.data = 1;
    break;
  case 0x10:
    *(undefined2 *)target._builder.data = 2;
    break;
  case 0x11:
    *(undefined2 *)target._builder.data = 3;
    break;
  case 0x12:
    *(undefined2 *)target._builder.data = 4;
    break;
  case 0x13:
    *(undefined2 *)target._builder.data = 5;
    break;
  case 0x14:
    *(undefined2 *)target._builder.data = 6;
    break;
  case 0x15:
    *(undefined2 *)target._builder.data = 7;
    break;
  case 0x16:
    *(undefined2 *)target._builder.data = 8;
    break;
  case 0x17:
    *(undefined2 *)target._builder.data = 9;
    break;
  case 0x18:
    *(undefined2 *)target._builder.data = 10;
    break;
  case 0x19:
    *(undefined2 *)target._builder.data = 0xb;
    break;
  case 0x1a:
    *(undefined2 *)target._builder.data = 0xc;
    break;
  case 0x1b:
    *(undefined2 *)target._builder.data = 0xd;
    break;
  case 0x1c:
    capnp::schema::Type::Builder::initList((Builder *)&_kjCondition,&target);
    capnp::schema::Type::List::Builder::initElementType((Builder *)&scopes,(Builder *)&_kjCondition)
    ;
    getListParam((BrandedDecl *)&_kjCondition);
    if ((BrandedDecl *)CONCAT71(uStack_11f,_kjCondition.value) == (BrandedDecl *)0x0) {
      message_01.content.size_ = 0x27;
      message_01.content.ptr = "\'List\' requires exactly one parameter.";
      ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                (errorReporter,&this->source,message_01);
    }
    else {
      target_03._builder.capTable = scopes.builder.capTable;
      target_03._builder.segment = scopes.builder.segment;
      target_03._builder.data = scopes.builder.ptr;
      target_03._builder.pointers = (WirePointer *)scopes.builder._24_8_;
      target_03._builder.dataSize = scopes.builder.structDataSize;
      target_03._builder.pointerCount = scopes.builder.structPointerCount;
      target_03._builder._38_1_ = scopes.builder.elementSize;
      target_03._builder._39_1_ = scopes.builder._39_1_;
      bVar4 = compileAsType((BrandedDecl *)CONCAT71(uStack_11f,_kjCondition.value),errorReporter,
                            target_03);
      if (bVar4) {
        if (*(short *)scopes.builder.ptr != 0x12) {
          return true;
        }
        if (*(short *)(scopes.builder.ptr + 10) == 0) {
          sVar7 = 0x25;
          pcVar8 = "\'List(AnyPointer)\' is not supported.";
        }
        else {
          if (*(short *)(scopes.builder.ptr + 10) != 1) {
            return true;
          }
          sVar7 = 0x24;
          pcVar8 = "\'List(AnyStruct)\' is not supported.";
        }
        message_02.content.size_ = sVar7;
        message_02.content.ptr = pcVar8;
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                  (errorReporter,&this->source,message_02);
        scopes.builder.ptr[0] = '\0';
        scopes.builder.ptr[1] = '\0';
      }
    }
    return false;
  case 0x1d:
    message_00.content.size_ = 0x8b;
    message_00.content.ptr =
         "As of Cap\'n Proto 0.4, \'Object\' has been renamed to \'AnyPointer\'.  Sorry for the inconvenience, and thanks for being an early adopter.  :)"
    ;
    ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
              (errorReporter,&this->source,message_00);
  case 0x1e:
    *(undefined2 *)target._builder.data = 0x12;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    *(undefined8 *)((long)target._builder.data + 0x10) = 0;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    break;
  case 0x1f:
    *(undefined2 *)target._builder.data = 0x12;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    *(undefined8 *)((long)target._builder.data + 0x10) = 0;
    *(undefined4 *)((long)target._builder.data + 8) = 0x10000;
    break;
  case 0x20:
    *(undefined2 *)target._builder.data = 0x12;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    *(undefined8 *)((long)target._builder.data + 0x10) = 0;
    *(undefined4 *)((long)target._builder.data + 8) = 0x20000;
    break;
  case 0x21:
    *(undefined2 *)target._builder.data = 0x12;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    *(undefined8 *)((long)target._builder.data + 0x10) = 0;
    *(undefined4 *)((long)target._builder.data + 8) = 0x30000;
    break;
  default:
    kj::_::unreachable();
  }
  return true;
}

Assistant:

bool BrandedDecl::compileAsType(
    ErrorReporter& errorReporter, schema::Type::Builder target) {
  KJ_IF_SOME(kind, getKind()) {
    switch (kind) {
      case Declaration::ENUM: {
        auto enum_ = target.initEnum();
        enum_.setTypeId(getIdAndFillBrand([&]() { return enum_.initBrand(); }));
        return true;
      }

      case Declaration::STRUCT: {
        auto struct_ = target.initStruct();
        struct_.setTypeId(getIdAndFillBrand([&]() { return struct_.initBrand(); }));
        return true;
      }

      case Declaration::INTERFACE: {
        auto interface = target.initInterface();
        interface.setTypeId(getIdAndFillBrand([&]() { return interface.initBrand(); }));
        return true;
      }

      case Declaration::BUILTIN_LIST: {
        auto elementType = target.initList().initElementType();

        KJ_IF_SOME(param, getListParam()) {
          if (!param.compileAsType(errorReporter, elementType)) {
            return false;
          }
        } else {
          addError(errorReporter, "'List' requires exactly one parameter.");
          return false;
        }

        if (elementType.isAnyPointer()) {
          auto unconstrained = elementType.getAnyPointer().getUnconstrained();

          if (unconstrained.isAnyKind()) {
            addError(errorReporter, "'List(AnyPointer)' is not supported.");
            // Seeing List(AnyPointer) later can mess things up, so change the type to Void.
            elementType.setVoid();
            return false;
          } else if (unconstrained.isStruct()) {
            addError(errorReporter, "'List(AnyStruct)' is not supported.");
            // Seeing List(AnyStruct) later can mess things up, so change the type to Void.
            elementType.setVoid();
            return false;
          }
        }

        return true;
      }

      case Declaration::BUILTIN_VOID: target.setVoid(); return true;
      case Declaration::BUILTIN_BOOL: target.setBool(); return true;
      case Declaration::BUILTIN_INT8: target.setInt8(); return true;
      case Declaration::BUILTIN_INT16: target.setInt16(); return true;
      case Declaration::BUILTIN_INT32: target.setInt32(); return true;
      case Declaration::BUILTIN_INT64: target.setInt64(); return true;
      case Declaration::BUILTIN_U_INT8: target.setUint8(); return true;
      case Declaration::BUILTIN_U_INT16: target.setUint16(); return true;
      case Declaration::BUILTIN_U_INT32: target.setUint32(); return true;
      case Declaration::BUILTIN_U_INT64: target.setUint64(); return true;
      case Declaration::BUILTIN_FLOAT32: target.setFloat32(); return true;
      case Declaration::BUILTIN_FLOAT64: target.setFloat64(); return true;
      case Declaration::BUILTIN_TEXT: target.setText(); return true;
      case Declaration::BUILTIN_DATA: target.setData(); return true;

      case Declaration::BUILTIN_OBJECT:
        addError(errorReporter,
            "As of Cap'n Proto 0.4, 'Object' has been renamed to 'AnyPointer'.  Sorry for the "
            "inconvenience, and thanks for being an early adopter.  :)");
        KJ_FALLTHROUGH;
      case Declaration::BUILTIN_ANY_POINTER:
        target.initAnyPointer().initUnconstrained().setAnyKind();
        return true;
      case Declaration::BUILTIN_ANY_STRUCT:
        target.initAnyPointer().initUnconstrained().setStruct();
        return true;
      case Declaration::BUILTIN_ANY_LIST:
        target.initAnyPointer().initUnconstrained().setList();
        return true;
      case Declaration::BUILTIN_CAPABILITY:
        target.initAnyPointer().initUnconstrained().setCapability();
        return true;

      case Declaration::FILE:
      case Declaration::USING:
      case Declaration::CONST:
      case Declaration::ENUMERANT:
      case Declaration::FIELD:
      case Declaration::UNION:
      case Declaration::GROUP:
      case Declaration::METHOD:
      case Declaration::ANNOTATION:
      case Declaration::NAKED_ID:
      case Declaration::NAKED_ANNOTATION:
        addError(errorReporter, kj::str("'", toString(), "' is not a type."));
        return false;
    }

    KJ_UNREACHABLE;
  }